

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void duckdb::QuantileOperation::
     WindowInit<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::hugeint_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               data_ptr_t g_state)

{
  WindowQuantileState<duckdb::hugeint_t> *this;
  QuantileSortTree *this_00;
  pointer __p;
  __uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_> local_28
  ;
  
  if ((*(long *)(partition + 0x70) < *(long *)(partition + 0x68)) ||
     ((double)(*(long *)(partition + 0x70) - *(long *)(partition + 0x68)) /
      (double)(*(long *)(partition + 0x78) - *(long *)(partition + 0x60)) <= 0.75)) {
    this = QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                     ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)g_state);
    this_00 = (QuantileSortTree *)operator_new(8);
    QuantileSortTree::QuantileSortTree(this_00,aggr_input_data,partition);
    local_28._M_t.
    super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
    .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false>._M_head_impl =
         (tuple<duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>)
         (_Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
          )0x0;
    std::__uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>::
    reset((__uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
           *)this,this_00);
    std::unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>::
    ~unique_ptr((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                 *)&local_28);
  }
  return;
}

Assistant:

static void WindowInit(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                       data_ptr_t g_state) {
		D_ASSERT(partition.inputs);

		const auto &stats = partition.stats;

		//	If frames overlap significantly, then use local skip lists.
		if (stats[0].end <= stats[1].begin) {
			//	Frames can overlap
			const auto overlap = double(stats[1].begin - stats[0].end);
			const auto cover = double(stats[1].end - stats[0].begin);
			const auto ratio = overlap / cover;
			if (ratio > .75) {
				return;
			}
		}

		//	Build the tree
		auto &state = *reinterpret_cast<STATE *>(g_state);
		auto &window_state = state.GetOrCreateWindowState();
		window_state.qst = make_uniq<QuantileSortTree>(aggr_input_data, partition);
	}